

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_SockAddr.cpp
# Opt level: O1

bool axl::io::isSockAddrMatch(sockaddr *addr,sockaddr *filterAddr)

{
  int iVar1;
  bool bVar2;
  
  if (filterAddr->sa_family == 10) {
    if (addr->sa_family == 10) {
      bVar2 = isSockAddrMatch_ip6((sockaddr_in6 *)addr,(sockaddr_in6 *)filterAddr);
      return bVar2;
    }
  }
  else if (filterAddr->sa_family == 2) {
    iVar1 = *(int *)(filterAddr->sa_data + 2);
    if ((iVar1 == 0) && (*(short *)addr->sa_data == *(short *)filterAddr->sa_data)) {
      return true;
    }
    if (addr->sa_family == 2) {
      if ((*(short *)filterAddr->sa_data == 0) ||
         (*(short *)addr->sa_data == *(short *)filterAddr->sa_data)) {
        return *(int *)(addr->sa_data + 2) == iVar1 || iVar1 == 0;
      }
    }
  }
  return false;
}

Assistant:

bool
isSockAddrMatch(
	const sockaddr* addr,
	const sockaddr* filterAddr
) {
	switch (filterAddr->sa_family) {
	case AF_INET:
		return
			*(const uint32_t*)&((const sockaddr_in*)filterAddr)->sin_addr == 0 &&
			((const sockaddr_in*)addr)->sin_port == ((const sockaddr_in*)filterAddr)->sin_port ||
			addr->sa_family == AF_INET &&
			isSockAddrMatch_ip4((const sockaddr_in*)addr, (const sockaddr_in*)filterAddr);

	case AF_INET6:
		return
			addr->sa_family == AF_INET6 &&
			isSockAddrMatch_ip6((const sockaddr_in6*)addr, (const sockaddr_in6*)filterAddr);

	default:
		return false;
	}
}